

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBShadeRow_C(uint8 *src_argb,uint8 *dst_argb,int width,uint32 value)

{
  uint8 uVar1;
  uint8 uVar2;
  uint8 uVar3;
  uint8 uVar4;
  uint8 uVar5;
  uint8 uVar6;
  uint32 a;
  uint32 r;
  uint32 g;
  uint32 b;
  int i;
  uint32 a_scale;
  uint32 r_scale;
  uint32 g_scale;
  uint32 b_scale;
  uint32 value_local;
  int width_local;
  uint8 *dst_argb_local;
  uint8 *src_argb_local;
  
  _value_local = dst_argb;
  dst_argb_local = src_argb;
  for (g = 0; (int)g < width; g = g + 1) {
    uVar1 = dst_argb_local[1];
    uVar2 = dst_argb_local[1];
    uVar3 = dst_argb_local[2];
    uVar4 = dst_argb_local[2];
    uVar5 = dst_argb_local[3];
    uVar6 = dst_argb_local[3];
    *_value_local =
         (uint8)((value & 0xff | (value & 0xff) << 8) *
                 (uint)CONCAT11(*dst_argb_local,*dst_argb_local) >> 0x18);
    _value_local[1] =
         (uint8)((value >> 8 & 0xff | (value >> 8 & 0xff) << 8) * (uint)CONCAT11(uVar2,uVar1) >>
                0x18);
    _value_local[2] =
         (uint8)((value >> 0x10 & 0xff | (value >> 0x10 & 0xff) << 8) * (uint)CONCAT11(uVar4,uVar3)
                >> 0x18);
    _value_local[3] =
         (uint8)((value >> 0x18 | (value >> 0x18) << 8) * (uint)CONCAT11(uVar6,uVar5) >> 0x18);
    dst_argb_local = dst_argb_local + 4;
    _value_local = _value_local + 4;
  }
  return;
}

Assistant:

void ARGBShadeRow_C(const uint8* src_argb,
                    uint8* dst_argb,
                    int width,
                    uint32 value) {
  const uint32 b_scale = REPEAT8(value & 0xff);
  const uint32 g_scale = REPEAT8((value >> 8) & 0xff);
  const uint32 r_scale = REPEAT8((value >> 16) & 0xff);
  const uint32 a_scale = REPEAT8(value >> 24);

  int i;
  for (i = 0; i < width; ++i) {
    const uint32 b = REPEAT8(src_argb[0]);
    const uint32 g = REPEAT8(src_argb[1]);
    const uint32 r = REPEAT8(src_argb[2]);
    const uint32 a = REPEAT8(src_argb[3]);
    dst_argb[0] = SHADE(b, b_scale);
    dst_argb[1] = SHADE(g, g_scale);
    dst_argb[2] = SHADE(r, r_scale);
    dst_argb[3] = SHADE(a, a_scale);
    src_argb += 4;
    dst_argb += 4;
  }
}